

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_st_asi(DisasContext_conflict8 *dc,TCGv_i32 src,TCGv_i32 addr,int insn,MemOp_conflict1 memop
               )

{
  TCGContext_conflict8 *tcg_ctx;
  TCGContext_conflict8 *tcg_ctx_00;
  ASIType AVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  uintptr_t o_3;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  DisasASI DVar4;
  TCGTemp *local_58;
  TCGv_i32 local_50;
  TCGv_i32 local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  tcg_ctx = dc->uc->tcg_ctx;
  DVar4 = get_asi(dc,insn,memop);
  AVar1 = DVar4.type;
  if (AVar1 == GET_ASI_EXCP) {
    return;
  }
  if (AVar1 != GET_ASI_DIRECT) {
    if (AVar1 != GET_ASI_DTWINX) {
      pTVar2 = tcg_const_i32_sparc64(tcg_ctx,DVar4.asi);
      pTVar3 = tcg_const_i32_sparc64(tcg_ctx,memop & MO_64);
      tcg_ctx_00 = dc->uc->tcg_ctx;
      tcg_gen_op2_sparc64(tcg_ctx_00,INDEX_op_movi_i64,
                          (TCGArg)(tcg_ctx_00->cpu_pc + (long)tcg_ctx_00),dc->pc);
      save_npc(dc);
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_50 = addr + (long)tcg_ctx;
      local_48 = src + (long)tcg_ctx;
      local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      local_38 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
      tcg_gen_callN_sparc64(tcg_ctx,helper_st_asi_sparc64,(TCGTemp *)0x0,5,&local_58);
      tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
      dc->npc = 1;
      return;
    }
    if ((dc->def->features & 0x800) == 0) {
      gen_exception(dc,0x10);
      return;
    }
  }
  if (dc->address_mask_32bit == true) {
    tcg_gen_andi_i64_sparc64(dc->uc->tcg_ctx,(TCGv_i64)addr,(TCGv_i64)addr,0xffffffff);
  }
  tcg_gen_qemu_st_i64_sparc64(tcg_ctx,(TCGv_i64)src,(TCGv_i64)addr,(long)DVar4.mem_idx,DVar4.memop);
  return;
}

Assistant:

static void gen_st_asi(DisasContext *dc, TCGv src, TCGv addr,
                       int insn, MemOp memop)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    DisasASI da = get_asi(dc, insn, memop);

    switch (da.type) {
    case GET_ASI_EXCP:
        break;
    case GET_ASI_DTWINX: /* Reserved for stda.  */
#ifndef TARGET_SPARC64
        gen_exception(dc, TT_ILL_INSN);
        break;
#else
        if (!(dc->def->features & CPU_FEATURE_HYPV)) {
            /* Pre OpenSPARC CPUs don't have these */
            gen_exception(dc, TT_ILL_INSN);
            return;
        }
        /* in OpenSPARC T1+ CPUs TWINX ASIs in store instructions
         * are ST_BLKINIT_ ASIs */
        /* fall through */
#endif
    case GET_ASI_DIRECT:
        gen_address_mask(dc, addr);
        tcg_gen_qemu_st_tl(tcg_ctx, src, addr, da.mem_idx, da.memop);
        break;
#if !defined(TARGET_SPARC64)
    case GET_ASI_BCOPY:
        /* Copy 32 bytes from the address in SRC to ADDR.  */
        /* ??? The original qemu code suggests 4-byte alignment, dropping
           the low bits, but the only place I can see this used is in the
           Linux kernel with 32 byte alignment, which would make more sense
           as a cacheline-style operation.  */
        {
            TCGv saddr = tcg_temp_new(tcg_ctx);
            TCGv daddr = tcg_temp_new(tcg_ctx);
            TCGv four = tcg_const_tl(tcg_ctx, 4);
            TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
            int i;

            tcg_gen_andi_tl(tcg_ctx, saddr, src, -4);
            tcg_gen_andi_tl(tcg_ctx, daddr, addr, -4);
            for (i = 0; i < 32; i += 4) {
                /* Since the loads and stores are paired, allow the
                   copy to happen in the host endianness.  */
                tcg_gen_qemu_ld_i32(tcg_ctx, tmp, saddr, da.mem_idx, MO_UL);
                tcg_gen_qemu_st_i32(tcg_ctx, tmp, daddr, da.mem_idx, MO_UL);
                tcg_gen_add_tl(tcg_ctx, saddr, saddr, four);
                tcg_gen_add_tl(tcg_ctx, daddr, daddr, four);
            }

            tcg_temp_free(tcg_ctx, saddr);
            tcg_temp_free(tcg_ctx, daddr);
            tcg_temp_free(tcg_ctx, four);
            tcg_temp_free_i32(tcg_ctx, tmp);
        }
        break;
#endif
    default:
        {
            TCGv_i32 r_asi = tcg_const_i32(tcg_ctx, da.asi);
            TCGv_i32 r_mop = tcg_const_i32(tcg_ctx, memop & MO_SIZE);

            save_state(dc);
#ifdef TARGET_SPARC64
            gen_helper_st_asi(tcg_ctx, tcg_ctx->cpu_env, addr, src, r_asi, r_mop);
#else
            {
                TCGv_i64 t64 = tcg_temp_new_i64(tcg_ctx);
                tcg_gen_extu_tl_i64(tcg_ctx, t64, src);
                gen_helper_st_asi(tcg_ctx, tcg_ctx->cpu_env, addr, t64, r_asi, r_mop);
                tcg_temp_free_i64(tcg_ctx, t64);
            }
#endif
            tcg_temp_free_i32(tcg_ctx, r_mop);
            tcg_temp_free_i32(tcg_ctx, r_asi);

            /* A write to a TLB register may alter page maps.  End the TB. */
            dc->npc = DYNAMIC_PC;
        }
        break;
    }
}